

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall QAbstractItemViewPrivate::checkPersistentEditorFocus(QAbstractItemViewPrivate *this)

{
  QAbstractItemView *this_00;
  Data *this_01;
  Node<QWidget_*,_QHashDummyValue> *pNVar1;
  long in_FS_OFFSET;
  QWidget *widget;
  int local_60;
  int local_5c;
  undefined1 *local_58;
  QAbstractItemModel *local_50;
  undefined8 local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  QWidget *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_28 = QApplication::focusWidget();
  if ((local_28 != (QWidget *)0x0) &&
     (this_01 = (this->persistent).q_hash.d, this_01 != (Data *)0x0)) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::findNode<QWidget*>
                       ((Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> *)this_01,&local_28);
    if (pNVar1 != (Node<QWidget_*,_QHashDummyValue> *)0x0) {
      local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      indexForEditor((QModelIndex *)&local_48,this,local_28);
      QItemSelectionModel::currentIndex();
      if ((((local_60 != (int)local_48) || (local_5c != local_48._4_4_)) || (local_58 != puStack_40)
          ) || (local_50 != local_38.ptr)) {
        QAbstractItemView::setCurrentIndex(this_00,(QModelIndex *)&local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::checkPersistentEditorFocus()
{
    Q_Q(QAbstractItemView);
    if (QWidget *widget = QApplication::focusWidget()) {
        if (persistent.contains(widget)) {
            //a persistent editor has gained the focus
            QModelIndex index = indexForEditor(widget);
            if (selectionModel->currentIndex() != index)
                q->setCurrentIndex(index);
        }
    }
}